

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O2

vector<Pt2i,_std::allocator<Pt2i>_> * __thiscall BiPtList::backPoints(BiPtList *this)

{
  vector<Pt2i,_std::allocator<Pt2i>_> *this_00;
  int i;
  int iVar1;
  _Self local_68;
  _Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*> local_48;
  
  this_00 = (vector<Pt2i,_std::allocator<Pt2i>_> *)operator_new(0x18);
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48._M_cur =
       (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  local_48._M_first =
       (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  local_48._M_last =
       (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  local_48._M_node =
       (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  std::_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*>::operator+=
            (&local_48,(long)this->start + 1);
  for (iVar1 = 0; iVar1 < ~this->start + this->cpt; iVar1 = iVar1 + 1) {
    std::_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*>::operator++(&local_68,&local_48,0);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back(this_00,local_68._M_cur);
  }
  return this_00;
}

Assistant:

std::vector<Pt2i> *BiPtList::backPoints () const
{
  std::vector<Pt2i> *res = new std::vector<Pt2i> ();
  std::deque<Pt2i>::const_iterator it = pts.begin ();
  it += start + 1;
  for (int i = 0; i < cpt - start - 1; i++) res->push_back (*it++);
  return res;
}